

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ASCIICharToWide(char *sASCII,size_t sASCII_length,wchar_t *wASCII,size_t wASCII_capacity)

{
  char cVar1;
  wchar_t *pwStack_38;
  char c;
  size_t i;
  size_t wASCII_capacity_local;
  wchar_t *wASCII_local;
  size_t sASCII_length_local;
  char *sASCII_local;
  
  if ((((sASCII != (char *)0x0) && (sASCII_length != 0)) && (wASCII != (wchar_t *)0x0)) &&
     ((wASCII_capacity != 0 && (sASCII_length <= wASCII_capacity)))) {
    pwStack_38 = (wchar_t *)0x0;
    while( true ) {
      wASCII_local = (wchar_t *)sASCII_length;
      if (((sASCII_length <= pwStack_38) || (cVar1 = sASCII[(long)pwStack_38], cVar1 < '\0')) ||
         ('\x7f' < cVar1)) goto LAB_006b1eae;
      if (cVar1 == '\0') break;
      wASCII[(long)pwStack_38] = (int)cVar1;
      pwStack_38 = (wchar_t *)((long)pwStack_38 + 1);
    }
    wASCII_local = (wchar_t *)((long)pwStack_38 + 1);
    wASCII[(long)pwStack_38] = L'\0';
    pwStack_38 = wASCII_local;
LAB_006b1eae:
    if (wASCII_local <= pwStack_38) {
      for (; pwStack_38 < wASCII_capacity; pwStack_38 = (wchar_t *)((long)pwStack_38 + 1)) {
        wASCII[(long)pwStack_38] = L'\0';
      }
      if (wASCII[wASCII_capacity - 1] == L'\0') {
        return true;
      }
    }
  }
  if ((wASCII != (wchar_t *)0x0) && (wASCII_capacity != 0)) {
    memset(wASCII,0,wASCII_capacity << 2);
  }
  return false;
}

Assistant:

static bool ASCIICharToWide(
  const char* sASCII,
  size_t sASCII_length,
  wchar_t* wASCII,
  size_t wASCII_capacity
  )
{
  for (;;)
  {
    if (nullptr == sASCII || sASCII_length <= 0)
      break;
    if (nullptr == wASCII || wASCII_capacity <= 0)
      break;
    if (wASCII_capacity < sASCII_length)
      break;

    size_t i;
    for (i = 0; i < sASCII_length; i++)
    {
      const char c = sASCII[i];
      if (c < 0 || c > 127)
        break;
      if (0 == c)
      {
        wASCII[i++] = 0;
        sASCII_length = i;
        break;
      }

      wASCII[i] = (wchar_t)c;
    }
    if ( i < sASCII_length )
      break;

    for(/*empty init*/;i < wASCII_capacity; i++)
      wASCII[i] = 0;

    if ( 0 != wASCII[wASCII_capacity-1])
      break;
    return true;
  }

  if ( nullptr != wASCII && wASCII_capacity > 0)
    memset(wASCII,0,wASCII_capacity*sizeof(wASCII[0]));

  return false;
}